

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testDeserializeQuoteRequest(int count)

{
  long lVar1;
  pointer pDataDictionary;
  long lVar2;
  int local_5c4;
  int j;
  long start;
  string string;
  allocator<char> local_539;
  CURRENCY local_538;
  Currency local_518;
  QTY local_4c0;
  OrderQty local_4b8;
  Side local_460;
  PRICE local_408;
  StrikePrice local_400;
  PutOrCall local_3a8;
  MaturityMonthYear local_350;
  allocator<char> local_2f1;
  STRING local_2f0;
  Symbol local_2d0;
  int local_274;
  undefined1 local_270 [4];
  int i;
  NoRelatedSym noRelatedSym;
  allocator<char> local_1e1;
  STRING local_1e0;
  QuoteReqID local_1c0;
  undefined1 local_168 [8];
  QuoteRequest message;
  int count_local;
  
  message.super_Message._340_4_ = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"1",&local_1e1);
  FIX::QuoteReqID::QuoteReqID(&local_1c0,&local_1e0);
  FIX42::QuoteRequest::QuoteRequest((QuoteRequest *)local_168,&local_1c0);
  FIX::QuoteReqID::~QuoteReqID(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_270);
  for (local_274 = 1; local_274 < 0xb; local_274 = local_274 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"IBM",&local_2f1);
    FIX::Symbol::Symbol(&local_2d0,&local_2f0);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_2d0);
    FIX::Symbol::~Symbol(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    FIX::MaturityMonthYear::MaturityMonthYear(&local_350);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_350);
    FIX::MaturityMonthYear::~MaturityMonthYear(&local_350);
    FIX::PutOrCall::PutOrCall(&local_3a8,0);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_3a8);
    FIX::PutOrCall::~PutOrCall(&local_3a8);
    local_408 = 120.0;
    FIX::StrikePrice::StrikePrice(&local_400,&local_408);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_400);
    FIX::StrikePrice::~StrikePrice(&local_400);
    FIX::Side::Side(&local_460,"11FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_460);
    FIX::Side::~Side(&local_460);
    local_4c0 = 100.0;
    FIX::OrderQty::OrderQty(&local_4b8,&local_4c0);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_4b8);
    FIX::OrderQty::~OrderQty(&local_4b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"USD",&local_539);
    FIX::Currency::Currency(&local_518,&local_538);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_518);
    FIX::Currency::~Currency(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator(&local_539);
    FIX::OrdType::OrdType((OrdType *)((long)&string.field_2 + 8),"1FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)local_270,(OrdType *)((long)&string.field_2 + 8));
    FIX::OrdType::~OrdType((OrdType *)((long)&string.field_2 + 8));
    FIX::Message::addGroup((Message *)local_168,(Group *)local_270);
  }
  FIX::Message::toString_abi_cxx11_((int)&start,(int)local_168,8);
  message.super_Message._340_4_ = message.super_Message._340_4_ + -1;
  lVar1 = GetTickCount();
  for (local_5c4 = 0; local_5c4 <= (int)message.super_Message._340_4_; local_5c4 = local_5c4 + 1) {
    pDataDictionary =
         std::unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>::get
                   (&s_dataDictionary);
    FIX::Message::setString((Message *)local_168,(string *)&start,false,pDataDictionary);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&start);
  FIX42::QuoteRequest::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)local_270);
  FIX42::QuoteRequest::~QuoteRequest((QuoteRequest *)local_168);
  return lVar2 - lVar1;
}

Assistant:

long testDeserializeQuoteRequest(int count) {
  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for (int i = 1; i <= 10; ++i) {
    noRelatedSym.set(FIX::Symbol("IBM"));
    noRelatedSym.set(FIX::MaturityMonthYear());
    noRelatedSym.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    noRelatedSym.set(FIX::StrikePrice(120));
    noRelatedSym.set(FIX::Side(FIX::Side_BUY));
    noRelatedSym.set(FIX::OrderQty(100));
    noRelatedSym.set(FIX::Currency("USD"));
    noRelatedSym.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(noRelatedSym);
  }
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    message.setString(string, DONT_VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}